

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

type __thiscall
cm::String::operator+=
          (String *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  char *pcVar1;
  const_pointer pvVar2;
  type pSVar3;
  undefined1 local_48 [8];
  string r;
  string_view v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  String *this_local;
  
  join_0x00000010_0x00000000_ =
       AsStringView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::view(s);
  std::__cxx11::string::string((string *)local_48);
  size(this);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&r.field_2 + 8));
  std::__cxx11::string::reserve((ulong)local_48);
  pcVar1 = data(this);
  size(this);
  std::__cxx11::string::assign(local_48,(ulong)pcVar1);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&r.field_2 + 8);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
  std::__cxx11::string::append(local_48,(ulong)pvVar2);
  pSVar3 = operator=(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48);
  std::__cxx11::string::~string((string *)local_48);
  return pSVar3;
}

Assistant:

typename std::enable_if<AsStringView<T>::value, String&>::type operator+=(
    T&& s)
  {
    string_view v = AsStringView<T>::view(std::forward<T>(s));
    std::string r;
    r.reserve(size() + v.size());
    r.assign(data(), size());
    r.append(v.data(), v.size());
    return *this = std::move(r);
  }